

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_device_job_thread_config ma_device_job_thread_config_init(void)

{
  return (ma_device_job_thread_config)ZEXT812(0x2000000000);
}

Assistant:

ma_device_job_thread_config_init(void)
{
    ma_device_job_thread_config config;

    MA_ZERO_OBJECT(&config);
    config.noThread         = MA_FALSE;
    config.jobQueueCapacity = MA_DEFAULT_DEVICE_JOB_QUEUE_CAPACITY;
    config.jobQueueFlags    = 0;

    return config;
}